

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Option<Catch::GroupInfo> * __thiscall
Catch::Option<Catch::GroupInfo>::operator=
          (Option<Catch::GroupInfo> *this,Option<Catch::GroupInfo> *_other)

{
  reset(this);
  if (_other->nullableValue != (GroupInfo *)0x0) {
    GroupInfo::GroupInfo((GroupInfo *)this->storage,_other->nullableValue);
    this->nullableValue = (GroupInfo *)this->storage;
  }
  return this;
}

Assistant:

Option& operator= ( Option const& _other ) {
            reset();
            if( _other )
                nullableValue = new( storage ) T( *_other );
            return *this;
        }